

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr
xmlCtxtNewInputFromIO
          (xmlParserCtxtPtr ctxt,char *url,xmlInputReadCallback ioRead,xmlInputCloseCallback ioClose
          ,void *ioCtxt,char *encoding,xmlParserInputFlags flags)

{
  xmlParserInputPtr input;
  char *encoding_local;
  void *ioCtxt_local;
  xmlInputCloseCallback ioClose_local;
  xmlInputReadCallback ioRead_local;
  char *url_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (ioRead == (xmlInputReadCallback)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)xmlNewInputFromIO(url,ioRead,ioClose,ioCtxt,flags);
    if (ctxt_local == (xmlParserCtxtPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else if (encoding != (char *)0x0) {
      xmlSwitchInputEncodingName(ctxt,(xmlParserInputPtr)ctxt_local,encoding);
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlCtxtNewInputFromIO(xmlParserCtxtPtr ctxt, const char *url,
                      xmlInputReadCallback ioRead,
                      xmlInputCloseCallback ioClose,
                      void *ioCtxt, const char *encoding,
                      xmlParserInputFlags flags) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (ioRead == NULL))
	return(NULL);

    input = xmlNewInputFromIO(url, ioRead, ioClose, ioCtxt, flags);
    if (input == NULL) {
        xmlCtxtErrMemory(ctxt);
        return(NULL);
    }

    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}